

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O2

bool dxil_spv::emit_annotate_node_handle(Impl *impl,CallInst *inst)

{
  pointer pNVar1;
  bool bVar2;
  Id id;
  ulong in_RAX;
  Value *pVVar3;
  CallInst *value;
  uint uStack_28;
  uint32_t node_meta_index;
  
  _uStack_28 = in_RAX;
  pVVar3 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  bVar2 = value_is_dx_op_instrinsic(pVVar3,IndexNodeHandle);
  pVVar3 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  if (bVar2) {
    id = Converter::Impl::get_id_for_value(impl,pVVar3,0);
LAB_001444d9:
    Converter::Impl::rewrite_value(impl,(Value *)inst,id);
    bVar2 = true;
  }
  else {
    bVar2 = value_is_dx_op_instrinsic(pVVar3,CreateNodeOutputHandle);
    if (bVar2) {
      pVVar3 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
      value = LLVMBC::cast<LLVMBC::CallInst>(pVVar3);
      _uStack_28 = (ulong)uStack_28;
      bVar2 = get_constant_operand(&value->super_Instruction,1,&node_meta_index);
      if (bVar2) {
        pNVar1 = (impl->node_outputs).
                 super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (_uStack_28 >> 0x20 <
            (ulong)(((long)(impl->node_outputs).
                           super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0xc)) {
          id = pNVar1[_uStack_28 >> 0x20].spec_constant_node_index;
          goto LAB_001444d9;
        }
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool emit_annotate_node_handle(Converter::Impl &impl, const llvm::CallInst *inst)
{
	// Not sure why there are two separate opcodes for annotating a handle, but DXIL's gonna DXIL ...
	if (value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::IndexNodeHandle))
	{
		// Trivially forward the annotation.
		impl.rewrite_value(inst, impl.get_id_for_value(inst->getOperand(1)));
		return true;
	}

	if (!value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::CreateNodeOutputHandle))
		return false;

	auto *node_output = llvm::cast<llvm::CallInst>(inst->getOperand(1));
	uint32_t node_meta_index = 0;
	if (!get_constant_operand(node_output, 1, &node_meta_index))
		return false;

	if (node_meta_index >= impl.node_outputs.size())
		return false;

	auto &node_meta = impl.node_outputs[node_meta_index];
	impl.rewrite_value(inst, node_meta.spec_constant_node_index);
	return true;
}